

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_casts.cpp
# Opt level: O3

BoundCastInfo *
duckdb::DefaultCasts::NumericCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  LogicalTypeId LVar1;
  InternalException *this;
  string local_40;
  
  LVar1 = source->id_;
  switch(LVar1) {
  case BOOLEAN:
    switch(target->id_) {
    case BOOLEAN:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<bool,bool,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case TINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<bool,signed_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case SMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<bool,short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case INTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<bool,int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<bool,long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    default:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,TryVectorNullCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DECIMAL:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::ToDecimalCast<bool>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case FLOAT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<bool,float,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DOUBLE:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<bool,double,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARCHAR:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::StringCast<bool,duckdb::StringCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UTINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<bool,unsigned_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case USMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<bool,unsigned_short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UINTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<bool,unsigned_int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UBIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<bool,unsigned_long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<bool,duckdb::NumericTryCastToBit>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARINT:
switchD_00ee214a_caseD_27:
      Varint::NumericToVarintCastSwitch(__return_storage_ptr__,source);
      return __return_storage_ptr__;
    case UHUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<bool,duckdb::uhugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case HUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<bool,duckdb::hugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
    }
    break;
  case TINYINT:
    switch(target->id_) {
    case BOOLEAN:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<signed_char,bool,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case TINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<signed_char,signed_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case SMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<signed_char,short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case INTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<signed_char,int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<signed_char,long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    default:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,TryVectorNullCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DECIMAL:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::ToDecimalCast<signed_char>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case FLOAT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<signed_char,float,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DOUBLE:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<signed_char,double,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARCHAR:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<signed_char,duckdb::StringCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UTINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<signed_char,unsigned_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case USMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<signed_char,unsigned_short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UINTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<signed_char,unsigned_int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UBIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<signed_char,unsigned_long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<signed_char,duckdb::NumericTryCastToBit>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARINT:
      goto switchD_00ee214a_caseD_27;
    case UHUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastLoop<signed_char,duckdb::uhugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case HUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastLoop<signed_char,duckdb::hugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
    }
    break;
  case SMALLINT:
    switch(target->id_) {
    case BOOLEAN:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<short,bool,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case TINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<short,signed_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case SMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<short,short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case INTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<short,int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<short,long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    default:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,TryVectorNullCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DECIMAL:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::ToDecimalCast<short>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case FLOAT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<short,float,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DOUBLE:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<short,double,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARCHAR:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::StringCast<short,duckdb::StringCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UTINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<short,unsigned_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case USMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<short,unsigned_short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UINTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<short,unsigned_int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UBIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<short,unsigned_long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<short,duckdb::NumericTryCastToBit>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARINT:
      goto switchD_00ee214a_caseD_27;
    case UHUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<short,duckdb::uhugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case HUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<short,duckdb::hugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
    }
    break;
  case INTEGER:
    switch(target->id_) {
    case BOOLEAN:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<int,bool,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case TINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<int,signed_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case SMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<int,short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case INTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<int,int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<int,long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    default:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,TryVectorNullCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DECIMAL:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::ToDecimalCast<int>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case FLOAT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<int,float,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DOUBLE:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<int,double,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARCHAR:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::StringCast<int,duckdb::StringCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UTINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<int,unsigned_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case USMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<int,unsigned_short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UINTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<int,unsigned_int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UBIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<int,unsigned_long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<int,duckdb::NumericTryCastToBit>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARINT:
      goto switchD_00ee214a_caseD_27;
    case UHUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<int,duckdb::uhugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case HUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<int,duckdb::hugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
    }
    break;
  case BIGINT:
    switch(target->id_) {
    case BOOLEAN:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<long,bool,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case TINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<long,signed_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case SMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<long,short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case INTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<long,int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<long,long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    default:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,TryVectorNullCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DECIMAL:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::ToDecimalCast<long>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case FLOAT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<long,float,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DOUBLE:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<long,double,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARCHAR:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::StringCast<long,duckdb::StringCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UTINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<long,unsigned_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case USMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<long,unsigned_short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UINTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<long,unsigned_int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UBIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<long,unsigned_long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<long,duckdb::NumericTryCastToBit>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARINT:
      goto switchD_00ee214a_caseD_27;
    case UHUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<long,duckdb::uhugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case HUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<long,duckdb::hugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
    }
    break;
  case DATE:
  case TIME:
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_NS:
  case DECIMAL:
  case CHAR:
  case VARCHAR:
  case BLOB:
  case INTERVAL:
switchD_00ee20d8_caseD_f:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"NumericCastSwitch called with non-numeric argument","");
    InternalException::InternalException(this,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    switch(target->id_) {
    case BOOLEAN:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<float,bool,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case TINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<float,signed_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case SMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<float,short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case INTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<float,int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<float,long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    default:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,TryVectorNullCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DECIMAL:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::ToDecimalCast<float>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case FLOAT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<float,float,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DOUBLE:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<float,double,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARCHAR:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::StringCast<float,duckdb::StringCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UTINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<float,unsigned_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case USMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<float,unsigned_short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UINTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<float,unsigned_int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UBIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<float,unsigned_long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<float,duckdb::NumericTryCastToBit>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARINT:
      goto switchD_00ee214a_caseD_27;
    case UHUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<float,duckdb::uhugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case HUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<float,duckdb::hugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
    }
    break;
  case DOUBLE:
    switch(target->id_) {
    case BOOLEAN:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<double,bool,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case TINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<double,signed_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case SMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<double,short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case INTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<double,int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<double,long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    default:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,TryVectorNullCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DECIMAL:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::ToDecimalCast<double>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case FLOAT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<double,float,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DOUBLE:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<double,double,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARCHAR:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::StringCast<double,duckdb::StringCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UTINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<double,unsigned_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case USMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<double,unsigned_short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UINTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<double,unsigned_int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UBIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<double,unsigned_long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<double,duckdb::NumericTryCastToBit>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARINT:
      goto switchD_00ee214a_caseD_27;
    case UHUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<double,duckdb::uhugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case HUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<double,duckdb::hugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
    }
    break;
  case UTINYINT:
    switch(target->id_) {
    case BOOLEAN:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_char,bool,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case TINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_char,signed_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case SMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_char,short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case INTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_char,int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_char,long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    default:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,TryVectorNullCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DECIMAL:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::ToDecimalCast<unsigned_char>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case FLOAT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_char,float,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DOUBLE:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_char,double,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARCHAR:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<unsigned_char,duckdb::StringCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UTINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_char,unsigned_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case USMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_char,unsigned_short,duckdb::NumericTryCast>
                 ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                   *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UINTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_char,unsigned_int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UBIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_char,unsigned_long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<unsigned_char,duckdb::NumericTryCastToBit>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARINT:
      goto switchD_00ee214a_caseD_27;
    case UHUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastLoop<unsigned_char,duckdb::uhugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case HUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastLoop<unsigned_char,duckdb::hugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
    }
    break;
  case USMALLINT:
    switch(target->id_) {
    case BOOLEAN:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_short,bool,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case TINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_short,signed_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case SMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_short,short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case INTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_short,int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_short,long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    default:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,TryVectorNullCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DECIMAL:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::ToDecimalCast<unsigned_short>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case FLOAT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_short,float,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DOUBLE:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_short,double,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARCHAR:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<unsigned_short,duckdb::StringCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UTINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_short,unsigned_char,duckdb::NumericTryCast>
                 ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                   *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case USMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastLoop<unsigned_short,unsigned_short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UINTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_short,unsigned_int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UBIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_short,unsigned_long,duckdb::NumericTryCast>
                 ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                   *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<unsigned_short,duckdb::NumericTryCastToBit>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARINT:
      goto switchD_00ee214a_caseD_27;
    case UHUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastLoop<unsigned_short,duckdb::uhugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case HUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastLoop<unsigned_short,duckdb::hugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
    }
    break;
  case UINTEGER:
    switch(target->id_) {
    case BOOLEAN:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_int,bool,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case TINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_int,signed_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case SMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_int,short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case INTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_int,int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_int,long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    default:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,TryVectorNullCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DECIMAL:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::ToDecimalCast<unsigned_int>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case FLOAT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_int,float,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DOUBLE:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_int,double,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARCHAR:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<unsigned_int,duckdb::StringCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UTINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_int,unsigned_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case USMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_int,unsigned_short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UINTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_int,unsigned_int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UBIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_int,unsigned_long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<unsigned_int,duckdb::NumericTryCastToBit>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARINT:
      goto switchD_00ee214a_caseD_27;
    case UHUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastLoop<unsigned_int,duckdb::uhugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case HUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastLoop<unsigned_int,duckdb::hugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
    }
    break;
  case UBIGINT:
    switch(target->id_) {
    case BOOLEAN:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_long,bool,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case TINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_long,signed_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case SMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_long,short,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case INTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_long,int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_long,long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    default:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,TryVectorNullCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DECIMAL:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,VectorCastHelpers::ToDecimalCast<unsigned_long>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case FLOAT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_long,float,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case DOUBLE:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_long,double,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARCHAR:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<unsigned_long,duckdb::StringCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UTINYINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_long,unsigned_char,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case USMALLINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_long,unsigned_short,duckdb::NumericTryCast>
                 ,(unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                   *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UINTEGER:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_long,unsigned_int,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case UBIGINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::TryCastLoop<unsigned_long,unsigned_long,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case BIT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::StringCast<unsigned_long,duckdb::NumericTryCastToBit>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case VARINT:
      goto switchD_00ee214a_caseD_27;
    case UHUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastLoop<unsigned_long,duckdb::uhugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
      break;
    case HUGEINT:
      local_40._M_dataplus._M_p = (pointer)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,
                 VectorCastHelpers::
                 TryCastLoop<unsigned_long,duckdb::hugeint_t,duckdb::NumericTryCast>,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)&local_40,(init_cast_local_state_t)0x0);
    }
    break;
  default:
    if (LVar1 == UHUGEINT) {
      switch(target->id_) {
      case BOOLEAN:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastLoop<duckdb::uhugeint_t,bool,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case TINYINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastLoop<duckdb::uhugeint_t,signed_char,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case SMALLINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastLoop<duckdb::uhugeint_t,short,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case INTEGER:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastLoop<duckdb::uhugeint_t,int,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case BIGINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastLoop<duckdb::uhugeint_t,long,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      default:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,TryVectorNullCast,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case DECIMAL:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,VectorCastHelpers::ToDecimalCast<duckdb::uhugeint_t>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case FLOAT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastLoop<duckdb::uhugeint_t,float,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case DOUBLE:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastLoop<duckdb::uhugeint_t,double,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case VARCHAR:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::StringCast<duckdb::uhugeint_t,duckdb::StringCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case UTINYINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastLoop<duckdb::uhugeint_t,unsigned_char,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case USMALLINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastLoop<duckdb::uhugeint_t,unsigned_short,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case UINTEGER:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastLoop<duckdb::uhugeint_t,unsigned_int,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case UBIGINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastLoop<duckdb::uhugeint_t,unsigned_long,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case BIT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::StringCast<duckdb::uhugeint_t,duckdb::NumericTryCastToBit>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case VARINT:
        goto switchD_00ee214a_caseD_27;
      case UHUGEINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case HUGEINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastLoop<duckdb::uhugeint_t,duckdb::hugeint_t,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
      }
    }
    else {
      if (LVar1 != HUGEINT) goto switchD_00ee20d8_caseD_f;
      switch(target->id_) {
      case BOOLEAN:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastLoop<duckdb::hugeint_t,bool,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case TINYINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastLoop<duckdb::hugeint_t,signed_char,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case SMALLINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastLoop<duckdb::hugeint_t,short,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case INTEGER:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastLoop<duckdb::hugeint_t,int,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case BIGINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastLoop<duckdb::hugeint_t,long,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      default:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,TryVectorNullCast,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case DECIMAL:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,VectorCastHelpers::ToDecimalCast<duckdb::hugeint_t>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case FLOAT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastLoop<duckdb::hugeint_t,float,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case DOUBLE:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::TryCastLoop<duckdb::hugeint_t,double,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case VARCHAR:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::StringCast<duckdb::hugeint_t,duckdb::StringCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case UTINYINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastLoop<duckdb::hugeint_t,unsigned_char,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case USMALLINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastLoop<duckdb::hugeint_t,unsigned_short,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case UINTEGER:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastLoop<duckdb::hugeint_t,unsigned_int,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case UBIGINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastLoop<duckdb::hugeint_t,unsigned_long,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case BIT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::StringCast<duckdb::hugeint_t,duckdb::NumericTryCastToBit>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case VARINT:
        goto switchD_00ee214a_caseD_27;
      case UHUGEINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastLoop<duckdb::hugeint_t,duckdb::uhugeint_t,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
        break;
      case HUGEINT:
        local_40._M_dataplus._M_p = (pointer)0x0;
        BoundCastInfo::BoundCastInfo
                  (__return_storage_ptr__,
                   VectorCastHelpers::
                   TryCastLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::NumericTryCast>,
                   (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                    *)&local_40,(init_cast_local_state_t)0x0);
      }
    }
  }
  if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::NumericCastSwitch(BindCastInput &input, const LogicalType &source,
                                              const LogicalType &target) {
	switch (source.id()) {
	case LogicalTypeId::BOOLEAN:
		return InternalNumericCastSwitch<bool>(source, target);
	case LogicalTypeId::TINYINT:
		return InternalNumericCastSwitch<int8_t>(source, target);
	case LogicalTypeId::SMALLINT:
		return InternalNumericCastSwitch<int16_t>(source, target);
	case LogicalTypeId::INTEGER:
		return InternalNumericCastSwitch<int32_t>(source, target);
	case LogicalTypeId::BIGINT:
		return InternalNumericCastSwitch<int64_t>(source, target);
	case LogicalTypeId::UTINYINT:
		return InternalNumericCastSwitch<uint8_t>(source, target);
	case LogicalTypeId::USMALLINT:
		return InternalNumericCastSwitch<uint16_t>(source, target);
	case LogicalTypeId::UINTEGER:
		return InternalNumericCastSwitch<uint32_t>(source, target);
	case LogicalTypeId::UBIGINT:
		return InternalNumericCastSwitch<uint64_t>(source, target);
	case LogicalTypeId::HUGEINT:
		return InternalNumericCastSwitch<hugeint_t>(source, target);
	case LogicalTypeId::UHUGEINT:
		return InternalNumericCastSwitch<uhugeint_t>(source, target);
	case LogicalTypeId::FLOAT:
		return InternalNumericCastSwitch<float>(source, target);
	case LogicalTypeId::DOUBLE:
		return InternalNumericCastSwitch<double>(source, target);
	default:
		throw InternalException("NumericCastSwitch called with non-numeric argument");
	}
}